

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

bool __thiscall cppforth::Forth::interpretNumbers(Forth *this,string *value)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  Cell CVar4;
  char *pcVar5;
  unsigned_long uVar6;
  int *piVar7;
  byte *pbVar8;
  int *piVar9;
  undefined8 uVar10;
  Cell numericBase;
  byte *pbVar11;
  byte *pbVar12;
  uint x;
  const_iterator cVar13;
  byte *__nptr;
  double x_00;
  const_iterator returnValue;
  const_iterator local_38;
  
  CVar4 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  uVar3 = value->_M_string_length;
  if ((uVar3 == 0) || (pcVar5 = (value->_M_dataplus)._M_p, pcVar5[uVar3 - 1] == '.')) {
LAB_0012c5c7:
    if ((uVar3 < 2) || (pcVar5 = (value->_M_dataplus)._M_p, pcVar5[uVar3 - 1] != '.')) {
LAB_0012c65b:
      if (((uVar3 == 3) && (pcVar5 = (value->_M_dataplus)._M_p, *pcVar5 == '\'')) &&
         (pcVar5[2] == '\'')) {
        x = (uint)(byte)pcVar5[1];
        goto LAB_0012c673;
      }
      __nptr = (byte *)(value->_M_dataplus)._M_p;
      pbVar8 = __nptr + value->_M_string_length;
      if ((*__nptr == 0x2b) || (pbVar12 = __nptr, *__nptr == 0x2d)) {
        pbVar12 = __nptr + 1;
      }
      pbVar11 = pbVar12;
      if (pbVar12 < pbVar8) {
        do {
          if (9 < (byte)(*pbVar11 - 0x30)) break;
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar8);
      }
      if (pbVar8 <= pbVar11 || pbVar11 <= pbVar12) {
        return false;
      }
      if ((*pbVar11 == 0x2e) && (pbVar11 = pbVar11 + 1, pbVar11 < pbVar8)) {
        do {
          if (9 < (byte)(*pbVar11 - 0x30)) break;
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar8);
      }
      if (pbVar8 <= pbVar11) {
        return false;
      }
      if ((*pbVar11 & 0xdf) != 0x45) {
        return false;
      }
      pbVar12 = pbVar11 + 1;
      if (pbVar12 < pbVar8) {
        if ((*pbVar12 == 0x2b) || (*pbVar12 == 0x2d)) {
          pbVar12 = pbVar11 + 2;
        }
        if (pbVar12 < pbVar8) {
          do {
            if (9 < (byte)(*pbVar12 - 0x30)) break;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar8);
        }
        if (pbVar12 != pbVar8) {
          return false;
        }
      }
      piVar9 = __errno_location();
      iVar2 = *piVar9;
      *piVar9 = 0;
      x_00 = strtod((char *)__nptr,&local_38._M_current);
      if ((byte *)local_38._M_current == __nptr) {
        uVar10 = std::__throw_invalid_argument("stod");
        if (*piVar9 == 0) {
          *piVar9 = iVar2;
        }
        _Unwind_Resume(uVar10);
      }
      if (*piVar9 == 0) {
        *piVar9 = iVar2;
LAB_0012c842:
        CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
        if (CVar4 != 0) {
          data(this,0x12);
          dataFloat(this,x_00);
          return true;
        }
        ForthStack<double>::push(&this->fStack,x_00);
        return true;
      }
      if (*piVar9 != 0x22) goto LAB_0012c842;
      std::__throw_out_of_range("stod");
    }
    else {
      cVar13._M_current = pcVar5 + (value->_M_string_length - 1);
      cVar1 = *pcVar5;
      if (cVar1 == '%') {
        pcVar5 = pcVar5 + 1;
        CVar4 = 2;
      }
      else if (cVar1 == '$') {
        pcVar5 = pcVar5 + 1;
        CVar4 = 0x10;
      }
      else if (cVar1 == '#') {
        pcVar5 = pcVar5 + 1;
        CVar4 = 10;
      }
      cVar1 = *pcVar5;
      local_38._M_current = pcVar5 + (cVar1 == '-');
      piVar7 = (int *)parseUnsignedNumber(local_38,cVar13,&local_38,CVar4);
      if (local_38._M_current != cVar13._M_current) goto LAB_0012c65b;
      piVar9 = (int *)-(long)piVar7;
      if (cVar1 != '-') {
        piVar9 = piVar7;
      }
      __nptr = (byte *)((ulong)piVar9 >> 0x20);
      CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
      if (CVar4 != 0) {
        data(this,1);
        data(this,(Cell)piVar9);
        data(this,1);
        x = (uint)((ulong)piVar9 >> 0x20);
        goto LAB_0012c7c0;
      }
    }
    ForthStack<unsigned_int>::push(&this->dStack,(uint)piVar9);
    x = (uint)__nptr;
  }
  else {
    cVar13._M_current = pcVar5 + uVar3;
    cVar1 = *pcVar5;
    if (cVar1 == '%') {
      pcVar5 = pcVar5 + 1;
      numericBase = 2;
    }
    else if (cVar1 == '$') {
      pcVar5 = pcVar5 + 1;
      numericBase = 0x10;
    }
    else {
      numericBase = CVar4;
      if (cVar1 == '#') {
        pcVar5 = pcVar5 + 1;
        numericBase = 10;
      }
    }
    cVar1 = *pcVar5;
    local_38._M_current = pcVar5 + (cVar1 == '-');
    uVar6 = parseUnsignedNumber(local_38,cVar13,&local_38,numericBase);
    if (local_38._M_current != cVar13._M_current) goto LAB_0012c5c7;
    x = -(uint)uVar6;
    if (cVar1 != '-') {
      x = (uint)uVar6;
    }
LAB_0012c673:
    CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
    if (CVar4 != 0) {
      data(this,1);
LAB_0012c7c0:
      data(this,x);
      return true;
    }
  }
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return true;
}

Assistant:

bool interpretNumbers(const std::string &value){
			int base = getNumericBase();
			auto valueSize=value.length();
			bool signNegative{};
			long long numericIntValue{};
			// consider it is signed int
			if(valueSize>0 && value[valueSize-1]!='.'){
				auto begin=value.begin();
				auto end=value.end();
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					int numberInt{static_cast<int>(numericIntValue)};
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberInt);
					}
					else {
						push(numberInt);
					}
					return true;
				}
			}

			// consider it is double int
			if(valueSize>1 && value[valueSize-1]=='.'){
				auto begin=value.begin();
				auto end=value.end()-1;
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					SDCell numberD(numericIntValue);
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.lo);
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.hi);
					}
					else {
						push(numberD.data_.Cells.lo);
						push(numberD.data_.Cells.hi);
					}
					return true;
				}

			}
			// consider it is char
			if (valueSize==3 && value[0]=='\'' and value[2]=='\''){
				unsigned number;
				number = static_cast<unsigned char>(value[1]);
				if (getIsCompiling()) {
					data(CELL(doLiteralXt));
					data(number);
				}
				else {
					push(number);
				}
				return true;
			}			
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
/*
if(0){
			std::smatch m1{};
			bool found{};
			static std::regex regexFloat{ "^[-+]?(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))([eE][-+]?[0-9]*)?$" };
			found = regex_search(value, m1, regexFloat);
			if (found){
				FCell number = std::stod(value);
				if (getIsCompiling()) {
					data(CELL(doFLiteralXt));
					dataFloat(number);
				}
				else {
					fStack.push(number);
				}
				return true;
			}
} else
*/
 			{
				// used for own calculation of value without library function
				//long long significandDigits{},exponentDigits0{};
				//double significandDigits0{};
				bool signNegative{},exponentSignNegative{};
				auto begin=value.begin();
				auto end=value.end();
				auto firstChar=*begin;
				if(firstChar=='-') { signNegative=true; ++begin;}
				else if(firstChar=='+') {signNegative=false; ++begin;}
				auto returnValue{begin};
				// own calculation: significandDigits=parseUnsignedNumber(begin,end,returnValue,10);
				skipDecimalDigits(begin,end,returnValue);
				if(returnValue>begin && returnValue<end){ // value has at least 1 decimal digit
					firstChar=*returnValue;
					if(firstChar=='.'){
						begin=++returnValue;
						// own calculation: significandDigits0=parseUnsignedNumberAsFloat(begin,end,returnValue,10);
						skipDecimalDigits(begin,end,returnValue);
					}
					if(returnValue<end){
						firstChar=*returnValue++;
						if(firstChar=='E' || firstChar=='e'){
							if(returnValue<end){
								firstChar=*returnValue;
								if(firstChar=='-') { exponentSignNegative=true; ++returnValue;}
								else if(firstChar=='+') {exponentSignNegative=false; ++returnValue;}
								begin=returnValue;
								// own calculation: exponentDigits0=parseUnsignedNumber(begin,end,returnValue,10);
								skipDecimalDigits(begin,end,returnValue);
								if(returnValue!=end){
									return false;
								}
								// own calculation: if(exponentSignNegative) exponentDigits0=-exponentDigits0;
							}
							// pattern matched
							// convert numbers to digits;
							
							// own calculation: double significant1=significandDigits;
							// own calculation: significant1+=significandDigits0;
							// own calculation: significant1*=std::pow(10,exponentDigits0);
							// own calculation: if(signNegative) significant1=-significant1;
							
							// standard library function provides better precision
							double significantStd=std::stod(value);
							//if(significant1!=significantStd){static int cnt=0;
							//std::cerr <<++cnt<<" Value "<<value<<" My "<<std::setprecision(20)<<significant1<< " , STD "<<std::setprecision(20)<<significantStd 
							//<<" Diff " <<(significant1-significantStd) 
							//<<std::endl;
							//}
							FCell number = significantStd;
							if (getIsCompiling()) {
								data(CELL(doFLiteralXt));
								dataFloat(number);
							}
							else {
								fStack.push(number);
							}
							return true;


						}
					}
				}
			}

#endif
			return false;
}